

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 ExprProcessFuncArguments
                (jx9_gen_state *pGen,jx9_expr_node *pOp,jx9_expr_node **apNode,sxi32 nToken)

{
  jx9_expr_node **apNode_00;
  uint uVar1;
  jx9_expr_node *pjVar2;
  bool bVar3;
  sxi32 sVar4;
  long lVar5;
  char *zFormat;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  if (0 < nToken) {
    iVar10 = 0;
    do {
      lVar5 = (long)iVar10;
      iVar6 = iVar10 + 1;
      if (iVar10 + 1 < nToken) {
        iVar6 = nToken;
      }
      bVar3 = true;
      iVar7 = 0;
      iVar8 = iVar10;
      do {
        pjVar2 = apNode[lVar5];
        if (pjVar2 != (jx9_expr_node *)0x0) {
          uVar1 = pjVar2->pStart->nType;
          if ((((uVar1 >> 0x11 & 1) != 0) && (pjVar2->pLeft == (jx9_expr_node *)0x0)) &&
             (iVar9 = iVar8, iVar7 < 1)) break;
          if ((uVar1 & 0xa40) == 0) {
            iVar7 = iVar7 + -1 + (uint)((uVar1 & 0x1480) == 0);
          }
          else {
            iVar7 = iVar7 + 1;
          }
        }
        lVar5 = lVar5 + 1;
        iVar8 = iVar8 + 1;
        bVar3 = lVar5 < (long)(ulong)(uint)nToken;
        iVar9 = iVar6;
      } while (lVar5 < (long)(ulong)(uint)nToken);
      if (iVar9 - iVar10 == 0 || iVar9 < iVar10) {
LAB_0012b307:
        zFormat = "Missing function argument";
LAB_0012b317:
        sVar4 = jx9GenCompileError(pGen,1,pOp->pStart->nLine,zFormat);
        return (uint)(sVar4 == -10) * 2 | 0xfffffff4;
      }
      apNode_00 = apNode + iVar10;
      ExprMakeTree(pGen,apNode_00,iVar9 - iVar10);
      if (*apNode_00 == (jx9_expr_node *)0x0) {
        zFormat = "Empty function argument";
        goto LAB_0012b317;
      }
      SySetPut(&pOp->aNodeArgs,apNode_00);
      iVar10 = iVar9;
      if (((bVar3) && (apNode[iVar9] != (jx9_expr_node *)0x0)) &&
         (((apNode[iVar9]->pStart->nType & 0x20000) != 0 && (iVar10 = iVar9 + 1, nToken <= iVar10)))
         ) goto LAB_0012b307;
    } while (iVar10 < nToken);
  }
  return 0;
}

Assistant:

static sxi32 ExprProcessFuncArguments(jx9_gen_state *pGen, jx9_expr_node *pOp, jx9_expr_node **apNode, sxi32 nToken)
{
	sxi32 iNest, iCur, iNode;
	sxi32 rc;
	/* Process function arguments from left to right */
	iCur = 0;
	for(;;){
		if( iCur >= nToken ){
			/* No more arguments to process */
			break;
		}
		iNode = iCur;
		iNest = 0;
		while( iCur < nToken ){
			if( apNode[iCur] ){
				if( (apNode[iCur]->pStart->nType & JX9_TK_COMMA) && apNode[iCur]->pLeft == 0 && iNest <= 0 ){
					break;
				}else if( apNode[iCur]->pStart->nType & (JX9_TK_LPAREN|JX9_TK_OSB|JX9_TK_OCB) ){
					iNest++;
				}else if( apNode[iCur]->pStart->nType & (JX9_TK_RPAREN|JX9_TK_CCB|JX9_TK_CSB) ){
					iNest--;
				}
			}
			iCur++;
		}
		if( iCur > iNode ){
			ExprMakeTree(&(*pGen), &apNode[iNode], iCur-iNode);
			if( apNode[iNode] ){
				/* Put a pointer to the root of the tree in the arguments set */
				SySetPut(&pOp->aNodeArgs, (const void *)&apNode[iNode]);
			}else{
				/* Empty function argument */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pOp->pStart->nLine, "Empty function argument");
				if( rc != SXERR_ABORT ){
					rc = SXERR_SYNTAX;
				}
				return rc;
			}
		}else{
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pOp->pStart->nLine, "Missing function argument");
			if( rc != SXERR_ABORT ){
				rc = SXERR_SYNTAX;
			}
			return rc;
		}
		/* Jump trailing comma */
		if( iCur < nToken && apNode[iCur] && (apNode[iCur]->pStart->nType & JX9_TK_COMMA) ){
			iCur++;
			if( iCur >= nToken ){
				/* missing function argument */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pOp->pStart->nLine, "Missing function argument");
				if( rc != SXERR_ABORT ){
					rc = SXERR_SYNTAX;
				}
				return rc;
			}
		}
	}
	return SXRET_OK;
}